

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

List * copy_list(List *ls)

{
  ListStruct *pLVar1;
  anon_union_8_7_0ba269be_for_u aVar2;
  char *pcVar3;
  unsigned_long uVar4;
  TokenType TVar5;
  undefined4 uVar6;
  List *pLVar7;
  List *pLVar8;
  
  if (ls == (List *)0x0) {
    pLVar7 = (List *)0x0;
  }
  else {
    pLVar7 = alloc_list();
    pLVar1 = ls->car;
    TVar5 = (ls->token).type;
    uVar6 = *(undefined4 *)&(ls->token).field_0x4;
    aVar2 = (ls->token).u;
    pcVar3 = (ls->token).filename;
    uVar4 = (ls->token).lineno;
    pLVar7->cdr = ls->cdr;
    pLVar7->car = pLVar1;
    (pLVar7->token).type = TVar5;
    *(undefined4 *)&(pLVar7->token).field_0x4 = uVar6;
    (pLVar7->token).u = aVar2;
    (pLVar7->token).filename = pcVar3;
    (pLVar7->token).lineno = uVar4;
    pLVar8 = copy_list(ls->car);
    pLVar7->car = pLVar8;
    pLVar8 = copy_list(ls->cdr);
    pLVar7->cdr = pLVar8;
  }
  return pLVar7;
}

Assistant:

List *
copy_list (const List *ls)
{
  List *new;

  if (ls == NULL)
    return NULL;

  new = alloc_list ();
  *new = *ls;
  new->car = copy_list (ls->car);
  new->cdr = copy_list (ls->cdr);

  return new;
}